

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O2

void __thiscall Formula_Context::Clean_Up(Formula_Context *this,Dependency **depends_on)

{
  Dependency *pDVar1;
  Dependency *this_00;
  
  this_00 = this->current_position;
  if (this_00 != (Dependency *)0x0) {
    if (this->last_position == (Dependency *)0x0) {
      *depends_on = (Dependency *)0x0;
      this_00 = this->current_position;
    }
    else {
      this->last_position->next = (Dependency *)0x0;
    }
    this->context->internal_remove = true;
    while (this_00 != (Dependency *)0x0) {
      pDVar1 = this_00->next;
      Dependency::Remove(this_00);
      (this_00->depended).data = (Am_Slot_Data *)0x0;
      this_00->next = (Dependency *)0x0;
      Dependency::operator_delete(this_00,0x18);
      this_00 = pDVar1;
    }
    this->context->internal_remove = false;
  }
  return;
}

Assistant:

void
Formula_Context::Clean_Up(Dependency **depends_on)
{
  if (current_position != nullptr) {
    if (last_position)
      last_position->next = nullptr;
    else
      *depends_on = nullptr;
    Dependency *current = current_position;
    Dependency *free_node;
    context->internal_remove = true;
    while (current) {
      free_node = current;
      current = current->next;
      free_node->Remove();
      free_node->depended = Am_Slot(nullptr);
      free_node->next = nullptr;
      delete free_node;
    }
    context->internal_remove = false;
  }
}